

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_regen_hp(player *p)

{
  short sVar1;
  ushort uVar2;
  int16_t *piVar3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  wVar6 = (wchar_t)p->timed[10];
  iVar8 = 0xc5;
  if (wVar6 < PY_FOOD_WEAK) {
    if (wVar6 < PY_FOOD_FAINT) {
      iVar8 = 0x21;
      if (wVar6 < PY_FOOD_STARVE) {
        iVar8 = 0;
      }
    }
    else {
      iVar8 = 0x62;
    }
  }
  sVar1 = p->chp;
  uVar2 = z_info->food_value;
  _Var4 = player_of_has(p,L'\f');
  if (player_turns_rested < L'\x05') {
    bVar9 = (~p->upkeep->resting & 0xfffcU) == 0;
  }
  else {
    bVar9 = true;
  }
  _Var5 = flag_has_dbg((p->state).pflags,10,0x4c,"p->state.pflags","(PF_REGENERATION)");
  iVar8 = ((((short)((short)(wVar6 / (int)(uint)uVar2) / 3 + 100) * iVar8) / 100 << _Var4) << bVar9)
          << _Var5;
  _Var4 = player_of_has(p,L'\x1a');
  if (_Var4) {
    iVar8 = iVar8 / 2;
  }
  piVar3 = p->timed;
  iVar7 = 0;
  if ((piVar3[9] == 0 && piVar3[8] == 0) && (piVar3[7] == 0 && piVar3[3] == 0)) {
    iVar7 = iVar8;
  }
  player_adjust_hp_precise(p,p->mhp * iVar7 + 0x5a2);
  if (sVar1 != p->chp) {
    equip_learn_flag(p,L'\f');
    equip_learn_flag(p,L'\x1a');
    return;
  }
  return;
}

Assistant:

void player_regen_hp(struct player *p)
{
	int32_t hp_gain;
	int percent = 0;/* max 32k -> 50% of mhp; more accurately "pertwobytes" */
	int fed_pct, old_chp = p->chp;

	/* Default regeneration */
	if (p->timed[TMD_FOOD] >= PY_FOOD_WEAK) {
		percent = PY_REGEN_NORMAL;
	} else if (p->timed[TMD_FOOD] >= PY_FOOD_FAINT) {
		percent = PY_REGEN_WEAK;
	} else if (p->timed[TMD_FOOD] >= PY_FOOD_STARVE) {
		percent = PY_REGEN_FAINT;
	}

	/* Food bonus - better fed players regenerate up to 1/3 faster */
	fed_pct = p->timed[TMD_FOOD] / z_info->food_value;
	percent *= 100 + fed_pct / 3;
	percent /= 100;

	/* Various things speed up regeneration */
	if (player_of_has(p, OF_REGEN))
		percent *= 2;
	if (player_resting_can_regenerate(p))
		percent *= 2;
	if (player_has(p, PF_REGENERATION))
		percent *= 2;

	/* Some things slow it down */
	if (player_of_has(p, OF_IMPAIR_HP))
		percent /= 2;

	/* Various things interfere with physical healing */
	if (p->timed[TMD_PARALYZED]) percent = 0;
	if (p->timed[TMD_POISONED]) percent = 0;
	if (p->timed[TMD_STUN]) percent = 0;
	if (p->timed[TMD_CUT]) percent = 0;

	/* Extract the new hitpoints */
	hp_gain = (int32_t)(p->mhp * percent) + PY_REGEN_HPBASE;
	player_adjust_hp_precise(p, hp_gain);

	/* Notice changes */
	if (old_chp != p->chp) {
		equip_learn_flag(p, OF_REGEN);
		equip_learn_flag(p, OF_IMPAIR_HP);
	}
}